

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

void Fraig_CollectXors(Fraig_Node_t *pNode1,Fraig_Node_t *pNode2,int iWordLast,int fUseRand,
                      uint *puMask)

{
  uint *puVar1;
  uint *local_50;
  int local_3c;
  int i;
  uint *pSims2;
  uint *pSims1;
  uint *puMask_local;
  int fUseRand_local;
  int iWordLast_local;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  
  if (((ulong)pNode1 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x1e2,
                  "void Fraig_CollectXors(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
                 );
  }
  if (((ulong)pNode2 & 1) != 0) {
    __assert_fail("!Fraig_IsComplement(pNode2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigTable.c"
                  ,0x1e3,
                  "void Fraig_CollectXors(Fraig_Node_t *, Fraig_Node_t *, int, int, unsigned int *)"
                 );
  }
  if (fUseRand == 0) {
    puVar1 = pNode1->puSimD;
    local_50 = pNode2->puSimD;
  }
  else {
    puVar1 = pNode1->puSimR;
    local_50 = pNode2->puSimR;
  }
  for (local_3c = 0; local_3c < iWordLast; local_3c = local_3c + 1) {
    puMask[local_3c] = puVar1[local_3c] ^ local_50[local_3c];
  }
  return;
}

Assistant:

void Fraig_CollectXors( Fraig_Node_t * pNode1, Fraig_Node_t * pNode2, int iWordLast, int fUseRand, unsigned * puMask )
{
    unsigned * pSims1, * pSims2;
    int i;
    assert( !Fraig_IsComplement(pNode1) );
    assert( !Fraig_IsComplement(pNode2) );
    // get hold of simulation info
    pSims1 = fUseRand? pNode1->puSimR : pNode1->puSimD;
    pSims2 = fUseRand? pNode2->puSimR : pNode2->puSimD;    
    // check the simulation info
    for ( i = 0; i < iWordLast; i++ )
        puMask[i] = ( pSims1[i] ^ pSims2[i] );
}